

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_decimal<unsigned__int128>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,unsigned___int128 value)

{
  undefined1 n [16];
  int iVar1;
  undefined8 in_RAX;
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar2;
  undefined8 unaff_RBX;
  internal *in_RSI;
  
  n._8_8_ = unaff_RBX;
  n._0_8_ = in_RAX;
  iVar1 = count_digits(in_RSI,(uint128_t)n);
  pwVar2 = reserve<duckdb_fmt::v6::internal::buffer<wchar_t>,_0>
                     ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_> *)this,
                      (long)iVar1);
  format_decimal<wchar_t,unsigned__int128,wchar_t*,duckdb_fmt::v6::internal::format_decimal<wchar_t,wchar_t*,unsigned__int128>(wchar_t*,unsigned__int128,int)::_lambda(wchar_t*)_1_>
            (pwVar2);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }